

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::
EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
::MoveNext(EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
           *this)

{
  int *piVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = IsValid(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x51c,"(IsValid())","IsValid()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  do {
    piVar1 = &(this->
              super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
              ).entryIndex;
    *piVar1 = *piVar1 + 1;
    bVar3 = IsValid(this);
    if (!bVar3) {
      return;
    }
  } while ((this->
           super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
           ).entries[(this->
                     super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                     ).entryIndex].
           super_DefaultHashedEntry<Wasm::WasmOp,_Wasm::WasmOp,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
           .super_ImplicitKeyValueEntry<Wasm::WasmOp,_Wasm::WasmOp>.
           super_ValueEntry<Wasm::WasmOp,_JsUtil::(anonymous_namespace)::ValueEntryData<Wasm::WasmOp>_>
           .super_ValueEntryData<Wasm::WasmOp>.next < -1);
  return;
}

Assistant:

void MoveNext()
            {
                Assert(IsValid());

                do
                {
                    ++(this->entryIndex);
                } while(IsValid() && IsFreeEntry(this->entries[this->entryIndex]));
            }